

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::tab_r::extract_ndf(tab_r *this,brdf *brdf,int res)

{
  pointer pfVar1;
  ulong uVar2;
  int k;
  int iVar3;
  long lVar4;
  uint size;
  ulong uVar5;
  int j;
  uint uVar6;
  vector<float,_std::allocator<float>_> *this_00;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  float local_dc;
  vector<double,_std::allocator<double>_> v;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> frp_v;
  matrix km;
  vector<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_> io;
  
  size = res - 1;
  matrix::matrix(&km,size);
  io.
  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  io.
  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  io.
  super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fVar16 = (float)(int)size;
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)size) {
    uVar6 = size;
  }
  frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  frp_v.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    fVar8 = ((float)(int)uVar7 / fVar16) * ((float)(int)uVar7 / fVar16) * 3.1415927 * 0.5;
    fVar9 = cosf(fVar8);
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = sinf(fVar8);
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
    _4_4_ = 0;
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish.
    _0_4_ = fVar9;
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish.
    _4_4_ = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_;
    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = fVar9;
    std::vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>::
    emplace_back<std::pair<djb::vec3,djb::vec3>>
              ((vector<std::pair<djb::vec3,djb::vec3>,std::allocator<std::pair<djb::vec3,djb::vec3>>>
                *)&io,(pair<djb::vec3,_djb::vec3> *)&v);
  }
  (*brdf->_vptr_brdf[3])(&v,brdf,&io,0);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::_M_move_assign
            (&frp_v,(valarray<float> *)&v);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&v);
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    fVar8 = (float)(int)uVar5 / fVar16;
    fVar8 = fVar8 * fVar8 * 3.1415927 * 0.5;
    fVar9 = cosf(fVar8);
    fVar8 = sinf(fVar8);
    std::valarray<float>::valarray
              ((valarray<float> *)&v,
               frp_v.
               super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar5);
    fVar10 = std::valarray<float>::sum((valarray<float> *)&v);
    uVar2 = CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_);
    for (uVar7 = 0; uVar7 != size; uVar7 = uVar7 + 1) {
      fVar11 = (float)(int)uVar7 / fVar16;
      fVar12 = fVar11 * fVar11 * 3.1415927 * 0.5;
      fVar13 = cosf(fVar12);
      fVar12 = sinf(fVar12);
      dVar17 = 0.0;
      for (iVar3 = 0; iVar3 != 0xb4; iVar3 = iVar3 + 1) {
        fVar14 = cosf(((float)iVar3 / 180.0 + (float)iVar3 / 180.0) * 3.1415927);
        fVar15 = fVar14 * fVar8 * fVar12 + fVar13 * fVar9;
        fVar14 = 0.0;
        if (0.0 <= fVar15) {
          fVar14 = fVar15;
        }
        fVar15 = 1.0;
        if (fVar14 <= 1.0) {
          fVar15 = fVar14;
        }
        dVar17 = dVar17 + (double)fVar15;
      }
      km.mij.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)(km.size * (int)uVar5 + uVar7)] =
           (double)(fVar11 * fVar12) *
           dVar17 * 0.034906586011250816 *
           (double)(fVar10 / (float)uVar2) * (3.1415927410125732 / (double)(int)size);
    }
    operator_delete((void *)CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish._4_4_,
                                     v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish._0_4_));
  }
  matrix::eigenvector(&v,&km,4);
  this_00 = &this->m_ndf;
  for (lVar4 = 0;
      lVar4 < (int)((ulong)(CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish._4_4_,
                                     v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish._0_4_) -
                           CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_)) >> 3);
      lVar4 = lVar4 + 1) {
    local_dc = (float)*(double *)
                       (CONCAT44(v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_) + lVar4 * 8);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,&local_dc);
  }
  pfVar1 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  fVar16 = pfVar1[(long)res + -2];
  fVar16 = (fVar16 + fVar16) - pfVar1[(long)res + -3];
  local_dc = 0.0;
  if (0.0 <= fVar16) {
    local_dc = fVar16;
  }
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this_00,&local_dc);
  fwrite("djb_verbose: NDF extraction complete\n",0x25,1,_stdout);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v.super__Vector_base<double,_std::allocator<double>_>);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector(&frp_v);
  std::
  _Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>::
  ~_Vector_base(&io.
                 super__Vector_base<std::pair<djb::vec3,_djb::vec3>,_std::allocator<std::pair<djb::vec3,_djb::vec3>_>_>
               );
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&km);
  return;
}

Assistant:

void tab_r::extract_ndf(const brdf &brdf, int res)
{
	const int cnt = res - 1;
	const double du = (double)m_pi() / cnt;
	matrix km(cnt);
	std::vector<brdf::io_pair> io;
	std::vector<brdf::value_type> frp_v;

	// evaluate all directions
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / (float_t)cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		io.push_back(brdf::io_pair(wi, wi));
	}
	frp_v = brdf.eval_batch(io);

	// build kernel
	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t ti = sqr(u) * m_pi() / 2;
		float_t zi = cos(ti), z_i = sin(ti);
		brdf::value_type frp = frp_v[i];
		float_t frp_i = frp.sum() / frp.size();//dot(frp, vec3(0.2126, 0.7152, 0.0722));
		double kji_tmp = (double)frp_i * du;

		for (int j = 0; j < cnt; ++j) {
			const int nk = 180;
			const double dk = 2 * (double)m_pi() / nk;
			float_t u = (float_t)j / cnt;
			float_t tm = sqr(u) * m_pi() / 2;
			float_t zm = cos(tm), z_m = sin(tm);
			double nint = 0;

			for (int k = 0; k < nk; ++k) {
				float_t u = (float_t)k / (float_t)nk;
				float_t pm = u * 2 * m_pi();

				nint+= (double)sat(z_i * z_m * cos(pm) + zi * zm);
			}
			nint*= dk;

			km(j, i) = kji_tmp * nint * (double)(u * z_m);
		}
	}

	// compute
	const std::vector<double> v = km.eigenvector(4);
	for (int i = 0; i < (int)v.size(); ++i)
		m_ndf.push_back(v[i]);
	m_ndf.push_back(max((float_t)0, 2 * m_ndf[cnt - 1] - m_ndf[cnt - 2]));

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF extraction complete\n");
#endif
}